

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Visitor<wasm::ReFinalizeNode,_void>::visit
          (Visitor<wasm::ReFinalizeNode,_void> *this,Expression *curr)

{
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      Block::finalize((Block *)curr);
      return;
    case IfId:
      If::finalize((If *)curr);
      return;
    case LoopId:
      Loop::finalize((Loop *)curr);
      return;
    case BreakId:
      Break::finalize((Break *)curr);
      return;
    case SwitchId:
      Switch::finalize((Switch *)curr);
      return;
    case CallId:
      Call::finalize((Call *)curr);
      return;
    case CallIndirectId:
      CallIndirect::finalize((CallIndirect *)curr);
      return;
    case LocalGetId:
    case GlobalGetId:
    case ReturnId:
    case NopId:
    case UnreachableId:
    case PopId:
      return;
    case LocalSetId:
      LocalSet::finalize((LocalSet *)curr);
      return;
    case GlobalSetId:
      GlobalSet::finalize((GlobalSet *)curr);
      return;
    case LoadId:
      Load::finalize((Load *)curr);
      return;
    case StoreId:
      Store::finalize((Store *)curr);
      return;
    case ConstId:
      Const::finalize((Const *)curr);
      return;
    case UnaryId:
      Unary::finalize((Unary *)curr);
      return;
    case BinaryId:
      Binary::finalize((Binary *)curr);
      return;
    case SelectId:
      Select::finalize((Select *)curr);
      return;
    case DropId:
      Drop::finalize((Drop *)curr);
      return;
    case MemorySizeId:
      MemorySize::finalize((MemorySize *)curr);
      return;
    case MemoryGrowId:
      MemoryGrow::finalize((MemoryGrow *)curr);
      return;
    case AtomicRMWId:
      AtomicRMW::finalize((AtomicRMW *)curr);
      return;
    case AtomicCmpxchgId:
      AtomicCmpxchg::finalize((AtomicCmpxchg *)curr);
      return;
    case AtomicWaitId:
      AtomicWait::finalize((AtomicWait *)curr);
      return;
    case AtomicNotifyId:
      AtomicNotify::finalize((AtomicNotify *)curr);
      return;
    case AtomicFenceId:
      AtomicFence::finalize((AtomicFence *)curr);
      return;
    case SIMDExtractId:
      SIMDExtract::finalize((SIMDExtract *)curr);
      return;
    case SIMDReplaceId:
      SIMDReplace::finalize((SIMDReplace *)curr);
      return;
    case SIMDShuffleId:
      SIMDShuffle::finalize((SIMDShuffle *)curr);
      return;
    case SIMDTernaryId:
      SIMDTernary::finalize((SIMDTernary *)curr);
      return;
    case SIMDShiftId:
      SIMDShift::finalize((SIMDShift *)curr);
      return;
    case SIMDLoadId:
      SIMDLoad::finalize((SIMDLoad *)curr);
      return;
    case SIMDLoadStoreLaneId:
      SIMDLoadStoreLane::finalize((SIMDLoadStoreLane *)curr);
      return;
    case MemoryInitId:
      MemoryInit::finalize((MemoryInit *)curr);
      return;
    case DataDropId:
      DataDrop::finalize((DataDrop *)curr);
      return;
    case MemoryCopyId:
      MemoryCopy::finalize((MemoryCopy *)curr);
      return;
    case MemoryFillId:
      MemoryFill::finalize((MemoryFill *)curr);
      return;
    case RefNullId:
      RefNull::finalize((RefNull *)curr);
      return;
    case RefIsNullId:
      RefIsNull::finalize((RefIsNull *)curr);
      return;
    case RefFuncId:
      RefFunc::finalize((RefFunc *)curr);
      return;
    case RefEqId:
      RefEq::finalize((RefEq *)curr);
      return;
    case TableGetId:
      TableGet::finalize((TableGet *)curr);
      return;
    case TableSetId:
      TableSet::finalize((TableSet *)curr);
      return;
    case TableSizeId:
      TableSize::finalize((TableSize *)curr);
      return;
    case TableGrowId:
      TableGrow::finalize((TableGrow *)curr);
      return;
    case TryId:
      Try::finalize((Try *)curr);
      return;
    case ThrowId:
      Throw::finalize((Throw *)curr);
      return;
    case RethrowId:
      Rethrow::finalize((Rethrow *)curr);
      return;
    case TupleMakeId:
      TupleMake::finalize((TupleMake *)curr);
      return;
    case TupleExtractId:
      TupleExtract::finalize((TupleExtract *)curr);
      return;
    case I31NewId:
      I31New::finalize((I31New *)curr);
      return;
    case I31GetId:
      I31Get::finalize((I31Get *)curr);
      return;
    case CallRefId:
      CallRef::finalize((CallRef *)curr);
      return;
    case RefTestId:
      RefTest::finalize((RefTest *)curr);
      return;
    case RefCastId:
      RefCast::finalize((RefCast *)curr);
      return;
    case BrOnId:
      BrOn::finalize((BrOn *)curr);
      return;
    case StructNewId:
      StructNew::finalize((StructNew *)curr);
      return;
    case StructGetId:
      StructGet::finalize((StructGet *)curr);
      return;
    case StructSetId:
      StructSet::finalize((StructSet *)curr);
      return;
    case ArrayNewId:
      ArrayNew::finalize((ArrayNew *)curr);
      return;
    case ArrayNewSegId:
      ArrayNewSeg::finalize((ArrayNewSeg *)curr);
      return;
    case ArrayNewFixedId:
      ArrayNewFixed::finalize((ArrayNewFixed *)curr);
      return;
    case ArrayGetId:
      ArrayGet::finalize((ArrayGet *)curr);
      return;
    case ArraySetId:
      ArraySet::finalize((ArraySet *)curr);
      return;
    case ArrayLenId:
      ArrayLen::finalize((ArrayLen *)curr);
      return;
    case ArrayCopyId:
      ArrayCopy::finalize((ArrayCopy *)curr);
      return;
    case ArrayFillId:
      ArrayFill::finalize((ArrayFill *)curr);
      return;
    case ArrayInitId:
      ArrayInit::finalize((ArrayInit *)curr);
      return;
    case RefAsId:
      RefAs::finalize((RefAs *)curr);
      return;
    case StringNewId:
      StringNew::finalize((StringNew *)curr);
      return;
    case StringConstId:
      StringConst::finalize((StringConst *)curr);
      return;
    case StringMeasureId:
      StringMeasure::finalize((StringMeasure *)curr);
      return;
    case StringEncodeId:
      StringEncode::finalize((StringEncode *)curr);
      return;
    case StringConcatId:
      StringConcat::finalize((StringConcat *)curr);
      return;
    case StringEqId:
      StringEq::finalize((StringEq *)curr);
      return;
    case StringAsId:
      StringAs::finalize((StringAs *)curr);
      return;
    case StringWTF8AdvanceId:
      StringWTF8Advance::finalize((StringWTF8Advance *)curr);
      return;
    case StringWTF16GetId:
      StringWTF16Get::finalize((StringWTF16Get *)curr);
      return;
    case StringIterNextId:
      StringIterNext::finalize((StringIterNext *)curr);
      return;
    case StringIterMoveId:
      StringIterMove::finalize((StringIterMove *)curr);
      return;
    case StringSliceWTFId:
      StringSliceWTF::finalize((StringSliceWTF *)curr);
      return;
    case StringSliceIterId:
      StringSliceIter::finalize((StringSliceIter *)curr);
      return;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                         ,0x45);
    }
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                ,0x3a,
                "ReturnType wasm::Visitor<wasm::ReFinalizeNode>::visit(Expression *) [SubType = wasm::ReFinalizeNode, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }